

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_CipherRules_Test::TestBody(SSLTest_CipherRules_Test *this)

{
  internal iVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  SSL_METHOD *pSVar5;
  SSL_CTX *pSVar6;
  OPENSSL_STACK *pOVar7;
  size_t sVar8;
  SSL_CIPHER *pSVar9;
  SSL_CTX *ctx_00;
  SSL_CTX *ctx_01;
  pointer *__ptr;
  size_t sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar11;
  char *in_R9;
  long lVar12;
  ScopedTrace *this_01;
  ulong uVar13;
  UniquePtr<SSL_CTX> ctx;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__2;
  ScopedTrace gtest_trace_574;
  ScopedTrace gtest_trace_596;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_a8;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  ScopedTrace local_41;
  AssertHelper local_40;
  ulong local_38;
  
  uVar13 = 0;
  lVar12 = 0;
  do {
    testing::ScopedTrace::ScopedTrace
              (&local_41,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x23e,*(char **)((long)&(anonymous_namespace)::kCipherTests + lVar12));
    pSVar5 = (SSL_METHOD *)TLS_method();
    local_a8._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(pSVar5);
    local_78[0] = (internal)(local_a8._M_head_impl != (SSL_CTX *)0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_a8._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x3442d9,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x240,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_58);
LAB_0015dd28:
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if ((SSL_CTX *)local_58._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_a8);
      testing::ScopedTrace::~ScopedTrace(&local_41);
      if ((uVar13 & 1) == 0) {
        return;
      }
      break;
    }
    iVar4 = SSL_CTX_set_cipher_list
                      ((SSL_CTX *)local_a8._M_head_impl,
                       *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar12));
    local_78[0] = (internal)(iVar4 != 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), t.rule)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x243,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_58);
      goto LAB_0015dd28;
    }
    local_38 = uVar13;
    bVar2 = CipherListsEqual(local_a8._M_head_impl,
                             (vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                              *)(&DAT_00451958 + lVar12));
    local_58._M_head_impl._0_1_ = bVar2;
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a0.data_)->line,"Cipher rule evaluated to:\n",0x1a);
      (anonymous_namespace)::CipherListToString_abi_cxx11_
                ((string *)local_98,(_anonymous_namespace_ *)local_a8._M_head_impl,ctx_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_a0.data_)->line,(char *)CONCAT71(local_98._1_7_,local_98[0]),
                 (long)local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_78,(internal *)&local_58,
                 (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x244,(char *)CONCAT44(local_78._4_4_,local_78._0_4_));
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_78._4_4_,local_78._0_4_),
                        local_68._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a0.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_a0.data_ + 8))();
      }
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    if ((&DAT_00451970)[lVar12] == '\x01') {
      iVar4 = SSL_CTX_set_strict_cipher_list
                        (local_a8._M_head_impl,
                         *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar12));
      local_78[0] = (internal)(iVar4 == 0);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 != 0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)local_78,
                   (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24a,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if ((SSL_CTX *)local_58._M_head_impl != (SSL_CTX *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      this_01 = &local_41;
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70;
        __ptr_00 = local_70;
LAB_0015dbd6:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()(this_00,__ptr_00);
      }
    }
    else {
      iVar4 = SSL_CTX_set_strict_cipher_list
                        (local_a8._M_head_impl,
                         *(char **)((long)&(anonymous_namespace)::kCipherTests + lVar12));
      local_78[0] = (internal)(iVar4 != 0);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)local_78,
                   (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule)","false",
                   "true",in_R9);
        uVar13 = local_38;
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24c,(char *)CONCAT71(local_98._1_7_,local_98[0]));
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_58);
        goto LAB_0015dd28;
      }
      bVar2 = CipherListsEqual(local_a8._M_head_impl,
                               (vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                                *)(&DAT_00451958 + lVar12));
      local_58._M_head_impl._0_1_ = bVar2;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      this_01 = (ScopedTrace *)&local_40;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a0.data_)->line,"Cipher rule evaluated to:\n",0x1a);
        (anonymous_namespace)::CipherListToString_abi_cxx11_
                  ((string *)local_98,(_anonymous_namespace_ *)local_a8._M_head_impl,ctx_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_a0.data_)->line,(char *)CONCAT71(local_98._1_7_,local_98[0]),
                   (long)local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_78,(internal *)&local_58,
                   (AssertionResult *)"CipherListsEqual(ctx.get(), t.expected)","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_01,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x24d,(char *)CONCAT44(local_78._4_4_,local_78._0_4_));
        testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._4_4_,local_78._0_4_) != &local_68) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_78._4_4_,local_78._0_4_),
                          local_68._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1
                         );
        }
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50;
        __ptr_00 = local_50;
        goto LAB_0015dbd6;
      }
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_a8);
    testing::ScopedTrace::~ScopedTrace(&local_41);
    lVar12 = lVar12 + 0x28;
    uVar13 = CONCAT71((int7)((ulong)this_01 >> 8),lVar12 == 1000);
  } while (lVar12 != 1000);
  bVar2 = false;
  lVar12 = 0;
  do {
    pcVar11 = *(char **)((long)&(anonymous_namespace)::kBadRules + lVar12);
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x254,pcVar11);
    pSVar5 = (SSL_METHOD *)TLS_method();
    pSVar6 = (SSL_CTX *)SSL_CTX_new(pSVar5);
    local_78[0] = (internal)(pSVar6 != (SSL_CTX *)0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar6;
    if (pSVar6 == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x3442d9,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x256,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
LAB_0015df97:
      if (!bVar2) {
        return;
      }
      break;
    }
    iVar4 = SSL_CTX_set_cipher_list((SSL_CTX *)pSVar6,pcVar11);
    local_78[0] = (internal)(iVar4 == 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_cipher_list(ctx.get(), rule)","true","false",in_R9)
      ;
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,600,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    ERR_clear_error();
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
    if (pSVar6 == (SSL_CTX *)0x0) goto LAB_0015df97;
    lVar12 = lVar12 + 8;
    bVar2 = lVar12 == 0x78;
  } while (!bVar2);
  bVar2 = false;
  lVar12 = 0;
  do {
    pcVar11 = *(char **)((long)&(anonymous_namespace)::kMustNotIncludeDeprecated + lVar12);
    local_38 = lVar12;
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x25d,pcVar11);
    pSVar5 = (SSL_METHOD *)TLS_method();
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SSL_CTX_new(pSVar5);
    local_78[0] = (internal)((SSL_CTX *)local_58._M_head_impl != (SSL_CTX *)0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((SSL_CTX *)local_58._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x3442d9,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x25f,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_0015e2af:
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
      if (!bVar2) {
        return;
      }
      break;
    }
    iVar4 = SSL_CTX_set_strict_cipher_list((SSL_CTX *)local_58._M_head_impl,pcVar11);
    local_78[0] = (internal)(iVar4 != 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x261,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      goto LAB_0015e2af;
    }
    pOVar7 = (OPENSSL_STACK *)SSL_CTX_get_ciphers((SSL_CTX *)local_58._M_head_impl);
    sVar8 = OPENSSL_sk_num(pOVar7);
    if (sVar8 != 0) {
      sVar10 = 0;
      do {
        pSVar9 = (SSL_CIPHER *)OPENSSL_sk_value(pOVar7,sVar10);
        local_78._0_4_ = 0;
        iVar4 = SSL_CIPHER_get_cipher_nid(pSVar9);
        local_a8._M_head_impl._0_4_ = iVar4;
        testing::internal::CmpHelperNE<int,int>
                  ((internal *)local_98,"0","SSL_CIPHER_get_cipher_nid(cipher)",(int *)local_78,
                   (int *)&local_a8);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_78);
          pcVar11 = "";
          if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar11 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x263,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_78);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if ((long *)CONCAT44(local_78._4_4_,local_78._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_78._4_4_,local_78._0_4_) + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
        bVar2 = ssl_cipher_is_deprecated(pSVar9);
        local_78[0] = (internal)!bVar2;
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar2) {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)local_78,
                     (AssertionResult *)"ssl_cipher_is_deprecated(cipher)","true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x264,(char *)CONCAT71(local_98._1_7_,local_98[0]));
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_98._1_7_,local_98[0]),
                            local_88._M_allocated_capacity + 1);
          }
          if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
            (**(code **)(*(long *)local_a8._M_head_impl + 8))();
          }
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
        sVar10 = sVar10 + 1;
      } while (sVar8 != sVar10);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_40);
    lVar12 = local_38 + 8;
    bVar2 = lVar12 == 0x50;
  } while (!bVar2);
  lVar12 = 0;
  do {
    pcVar11 = *(char **)((long)&(anonymous_namespace)::kShouldIncludeCBCSHA256 + lVar12);
    pSVar5 = (SSL_METHOD *)TLS_method();
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         SSL_CTX_new(pSVar5);
    iVar1 = (internal)((SSL_CTX *)local_58._M_head_impl != (SSL_CTX *)0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_78[0] = iVar1;
    if ((SSL_CTX *)local_58._M_head_impl == (SSL_CTX *)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)0x3442d9,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26b,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
LAB_0015e542:
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
      return;
    }
    iVar4 = SSL_CTX_set_strict_cipher_list((SSL_CTX *)local_58._M_head_impl,pcVar11);
    local_78[0] = (internal)(iVar4 != 0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,
                 (AssertionResult *)"SSL_CTX_set_strict_cipher_list(ctx.get(), rule)","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26c,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      goto LAB_0015e542;
    }
    pOVar7 = (OPENSSL_STACK *)SSL_CTX_get_ciphers((SSL_CTX *)local_58._M_head_impl);
    sVar8 = OPENSSL_sk_num(pOVar7);
    if (sVar8 != 0) {
      sVar10 = 0;
      do {
        pSVar9 = (SSL_CIPHER *)OPENSSL_sk_value(pOVar7,sVar10);
        uVar3 = SSL_CIPHER_get_protocol_id(pSVar9);
        if (uVar3 == 0xc027) {
          local_78[0] = (internal)0x1;
          goto LAB_0015e3c0;
        }
        sVar10 = sVar10 + 1;
      } while (sVar8 != sVar10);
    }
    local_78[0] = (internal)0x0;
LAB_0015e3c0:
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_78,(AssertionResult *)"found","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x276,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_a8._M_head_impl != (SSL_CTX *)0x0) {
        (**(code **)(*(long *)local_a8._M_head_impl + 8))();
      }
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_58);
    lVar12 = lVar12 + 8;
    if (lVar12 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

TEST(SSLTest, CipherRules) {
  for (const CipherTest &t : kCipherTests) {
    SCOPED_TRACE(t.rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    // Test lax mode.
    ASSERT_TRUE(SSL_CTX_set_cipher_list(ctx.get(), t.rule));
    EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
        << "Cipher rule evaluated to:\n"
        << CipherListToString(ctx.get());

    // Test strict mode.
    if (t.strict_fail) {
      EXPECT_FALSE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
    } else {
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), t.rule));
      EXPECT_TRUE(CipherListsEqual(ctx.get(), t.expected))
          << "Cipher rule evaluated to:\n"
          << CipherListToString(ctx.get());
    }
  }

  for (const char *rule : kBadRules) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    EXPECT_FALSE(SSL_CTX_set_cipher_list(ctx.get(), rule));
    ERR_clear_error();
  }

  for (const char *rule : kMustNotIncludeDeprecated) {
    SCOPED_TRACE(rule);
    bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
    ASSERT_TRUE(ctx);

    ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));
    for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
      EXPECT_NE(NID_undef, SSL_CIPHER_get_cipher_nid(cipher));
      EXPECT_FALSE(ssl_cipher_is_deprecated(cipher));
    }
  }

  {
    for (const char *rule : kShouldIncludeCBCSHA256) {
      bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
      ASSERT_TRUE(ctx);
      ASSERT_TRUE(SSL_CTX_set_strict_cipher_list(ctx.get(), rule));

      bool found = false;
      for (const SSL_CIPHER *cipher : SSL_CTX_get_ciphers(ctx.get())) {
        if ((TLS1_CK_ECDHE_RSA_WITH_AES_128_CBC_SHA256 & 0xffff) ==
            SSL_CIPHER_get_protocol_id(cipher)) {
          found = true;
          break;
        }
      }
      EXPECT_TRUE(found);
    }
  }
}